

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<double>,testing::Matcher<double>,testing::Matcher<mp::var::Type>>,std::tuple<double,double,mp::var::Type>>
               (tuple<testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                *matcher_tuple,tuple<double,_double,_mp::var::Type> *value_tuple)

{
  char cVar1;
  undefined1 uVar2;
  
  cVar1 = (**(code **)(*(long *)(matcher_tuple->
                                super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                                ).super__Head_base<0UL,_testing::Matcher<double>,_false>.
                                _M_head_impl.super_MatcherBase<double>.impl_.value_ + 0x20))
                    ((value_tuple->super__Tuple_impl<0UL,_double,_double,_mp::var::Type>).
                     super__Head_base<0UL,_double,_false>._M_head_impl);
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = (**(code **)(*(long *)(matcher_tuple->
                                  super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                                  ).
                                  super__Tuple_impl<1UL,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                                  .super__Head_base<1UL,_testing::Matcher<double>,_false>.
                                  _M_head_impl.super_MatcherBase<double>.impl_.value_ + 0x20))
                      ((value_tuple->super__Tuple_impl<0UL,_double,_double,_mp::var::Type>).
                       super__Tuple_impl<1UL,_double,_mp::var::Type>.
                       super__Head_base<1UL,_double,_false>._M_head_impl);
  }
  return (bool)uVar2;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }